

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O0

ClauseIterator __thiscall Inferences::SubVarSup::generateClauses(SubVarSup *this,Clause *premise)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i_00;
  ForwardResultFn f;
  Ordering *ord;
  Clause *in_RDX;
  SubVarSup *in_RSI;
  RewriteableSubtermsFn *in_RDI;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  itb;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  itf;
  Clause *in_stack_fffffffffffffa10;
  RewriteableSubtermsFn *this_00;
  undefined1 *puVar1;
  undefined8 in_stack_fffffffffffffa38;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffa40;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
  *in_stack_fffffffffffffab0;
  SubVarSupLHSIteratorFn in_stack_fffffffffffffab8;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  *in_stack_fffffffffffffad0;
  RewritableResultsFn in_stack_fffffffffffffad8;
  BackwardResultFn in_stack_fffffffffffffae0;
  IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
  *in_stack_fffffffffffffb18;
  undefined1 local_4e0 [8];
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  *in_stack_fffffffffffffb28;
  Clause *in_stack_fffffffffffffb30;
  SubVarSup *in_stack_fffffffffffffb38;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  *in_stack_fffffffffffffb50;
  ApplicableRewritesFn in_stack_fffffffffffffb58;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  *in_stack_fffffffffffffc30;
  Entry *in_stack_fffffffffffffc38;
  BackwardResultFn local_308;
  RewritableResultsFn local_2f8;
  SubVarSupLHSIteratorFn local_2f0;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  *local_2e8;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  *pIStack_2e0;
  ForwardResultFn local_1e8;
  ApplicableRewritesFn local_1d8 [3];
  undefined1 local_1c0 [72];
  undefined1 local_178 [352];
  Clause *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  Kernel::Clause::getSelectedLiteralIterator(in_stack_fffffffffffffa10);
  puVar1 = local_178;
  i._iter._inner._next = (int)in_stack_fffffffffffffa38;
  i._iter._inner._from = (int)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  i._iter._func.a = (Clause *)puVar1;
  i._iter._16_8_ = in_stack_fffffffffffffa40;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i);
  Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x829ce8);
  puVar2 = local_1c0;
  RewriteableSubtermsFn::RewriteableSubtermsFn(this_00,(Ordering *)in_RDI,in_stack_fffffffffffffa10)
  ;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Inferences::SubVarSup::RewriteableSubtermsFn>
            ((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)in_stack_fffffffffffffb38,(RewriteableSubtermsFn *)in_stack_fffffffffffffb30);
  ApplicableRewritesFn::ApplicableRewritesFn(local_1d8,in_RSI->_lhsIndex);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::ApplicableRewritesFn>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  ForwardResultFn::ForwardResultFn(&local_1e8,local_18,in_RSI);
  f._parent = in_stack_fffffffffffffb38;
  f._cl = in_stack_fffffffffffffb30;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::ForwardResultFn>(in_stack_fffffffffffffb28,f);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
                 *)0x829da5);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
                 *)0x829db2);
  RewriteableSubtermsFn::~RewriteableSubtermsFn((RewriteableSubtermsFn *)0x829dbf);
  Kernel::Clause::getSelectedLiteralIterator(in_stack_fffffffffffffa10);
  i_00._iter._inner._0_8_ = puVar2;
  i_00._iter._func.a = (Clause *)puVar1;
  i_00._iter._16_8_ = in_stack_fffffffffffffa40;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i_00);
  ord = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x829e0d);
  Kernel::EqHelper::SubVarSupLHSIteratorFn::SubVarSupLHSIteratorFn(&local_2f0,ord);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Kernel::EqHelper::SubVarSupLHSIteratorFn>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffab8);
  RewritableResultsFn::RewritableResultsFn(&local_2f8,in_RSI->_subtermIndex);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::RewritableResultsFn>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffad8);
  BackwardResultFn::BackwardResultFn(&local_308,local_18,in_RSI);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::BackwardResultFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)in_stack_fffffffffffffad8._index,in_stack_fffffffffffffae0);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
                 *)0x829ece);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
                 *)0x829edb);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  ::IterTraits(pIStack_2e0,local_2e8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  ::IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
                *)pIStack_2e0,
               (IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
                *)local_2e8);
  Lib::
  concatIters<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>
            ((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
              *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  Lib::
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
  ::filter<Lib::NonzeroFn>
            ((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)&stack0xfffffffffffffc00,local_4e0);
  Lib::
  pvi<Lib::IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>,Lib::NonzeroFn,false>>>
            (in_stack_fffffffffffffb18);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
                 *)0x829f5a);
  Lib::
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
                 *)0x829f67);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
                 *)0x829f71);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
                 *)0x829f7e);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
                 *)0x829f8b);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
                 *)0x829f98);
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this_00;
}

Assistant:

ClauseIterator SubVarSup::generateClauses(Clause* premise)
{
  //cout << "SubVarSup with " << premise->toString() << endl;

  auto itf = iterTraits(premise->getSelectedLiteralIterator())
  // Get an iterator of pairs of selected literals and rewritable subterms of those literals
  // A subterm is rewritable (see EqHelper) if
  //  a) The literal is a positive equality t1=t2 and the subterm is max(t1,t2) wrt ordering
  //  b) The subterm is not a variable
     .flatMap(RewriteableSubtermsFn(_salg->getOrdering(), premise))

  // Get clauses with a literal whose complement unifies with the rewritable subterm,
  // returns a pair with the original pair and the unification result (includes substitution)
     .flatMap(ApplicableRewritesFn(_lhsIndex))

  //Perform forward SubVarSup
     .map(ForwardResultFn(premise, *this));

  auto itb = iterTraits(premise->getSelectedLiteralIterator())
             .flatMap(EqHelper::SubVarSupLHSIteratorFn(_salg->getOrdering()))
             .flatMap(RewritableResultsFn(_subtermIndex))
  //Perform backward SubVarSup
             .map(BackwardResultFn(premise, *this));

  // Add the results of forward and backward together
  return pvi(concatIters(std::move(itf),std::move(itb))
  // Remove null elements - these can come from performSubVarSup
          .filter(NonzeroFn()));
}